

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

int xmlXPathContextSetCache(xmlXPathContextPtr ctxt,int active,int value,int options)

{
  xmlXPathContextCachePtr cache;
  int iVar1;
  
  iVar1 = -1;
  if (ctxt != (xmlXPathContextPtr)0x0) {
    cache = (xmlXPathContextCachePtr)ctxt->cache;
    if (active == 0) {
      iVar1 = 0;
      if (cache != (xmlXPathContextCachePtr)0x0) {
        xmlXPathFreeCache(cache);
        ctxt->cache = (void *)0x0;
      }
    }
    else {
      if (cache == (xmlXPathContextCachePtr)0x0) {
        cache = (xmlXPathContextCachePtr)(*xmlMalloc)(0x20);
        if (cache == (xmlXPathContextCachePtr)0x0) {
          ctxt->cache = (void *)0x0;
          xmlXPathErrMemory(ctxt);
          return -1;
        }
        cache->numNodeset = 0;
        cache->maxNodeset = 0;
        cache->numMisc = 0;
        cache->maxMisc = 0;
        cache->nodesetObjs = (xmlXPathObjectPtr)0x0;
        cache->miscObjs = (xmlXPathObjectPtr)0x0;
        cache->maxNodeset = 100;
        cache->maxMisc = 100;
        ctxt->cache = cache;
      }
      iVar1 = 0;
      if (options == 0) {
        iVar1 = 100;
        if (-1 < value) {
          iVar1 = value;
        }
        cache->maxNodeset = iVar1;
        cache->maxMisc = iVar1;
        iVar1 = 0;
      }
    }
  }
  return iVar1;
}

Assistant:

int
xmlXPathContextSetCache(xmlXPathContextPtr ctxt,
			int active,
			int value,
			int options)
{
    if (ctxt == NULL)
	return(-1);
    if (active) {
	xmlXPathContextCachePtr cache;

	if (ctxt->cache == NULL) {
	    ctxt->cache = xmlXPathNewCache();
	    if (ctxt->cache == NULL) {
                xmlXPathErrMemory(ctxt);
		return(-1);
            }
	}
	cache = (xmlXPathContextCachePtr) ctxt->cache;
	if (options == 0) {
	    if (value < 0)
		value = 100;
	    cache->maxNodeset = value;
	    cache->maxMisc = value;
	}
    } else if (ctxt->cache != NULL) {
	xmlXPathFreeCache((xmlXPathContextCachePtr) ctxt->cache);
	ctxt->cache = NULL;
    }
    return(0);
}